

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cc
# Opt level: O2

void __thiscall
tt::AsyncLogging::AsyncLogging(AsyncLogging *this,string *basename,int flushInterval)

{
  FixedBuffer<4000000> *pFVar1;
  _Bind<void_(tt::AsyncLogging::*(tt::AsyncLogging_*))()> local_a8;
  ThreadFunc local_90;
  string local_70;
  string *local_50;
  Thread *local_48;
  CountDownLatch *local_40;
  allocator local_31;
  
  this->m_flushInterval = flushInterval;
  this->m_running = false;
  std::__cxx11::string::string((string *)&this->m_basename,(string *)basename);
  local_a8._M_f = (offset_in_AsyncLogging_to_subr)threadFunc;
  local_a8._8_8_ = 0;
  local_a8._M_bound_args.super__Tuple_impl<0UL,_tt::AsyncLogging_*>.
  super__Head_base<0UL,_tt::AsyncLogging_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_tt::AsyncLogging_*>)(_Tuple_impl<0UL,_tt::AsyncLogging_*>)this;
  local_50 = &this->m_basename;
  std::function<void()>::function<std::_Bind<void(tt::AsyncLogging::*(tt::AsyncLogging*))()>,void>
            ((function<void()> *)&local_90,&local_a8);
  std::__cxx11::string::string((string *)&local_70,"Logging",&local_31);
  Thread::Thread(&this->m_thread,&local_90,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  local_40 = &this->m_latch;
  local_48 = &this->m_thread;
  CountDownLatch::CountDownLatch(local_40,1);
  MutexLock::MutexLock(&this->m_mutex);
  Condition::Condition(&this->m_cond,&this->m_mutex);
  pFVar1 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFVar1->m_cur = (char *)pFVar1;
  std::__shared_ptr<tt::detail::FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tt::detail::FixedBuffer<4000000>,void>
            ((__shared_ptr<tt::detail::FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2> *)
             &this->m_currentBuffer,pFVar1);
  pFVar1 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFVar1->m_cur = (char *)pFVar1;
  std::__shared_ptr<tt::detail::FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tt::detail::FixedBuffer<4000000>,void>
            ((__shared_ptr<tt::detail::FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2> *)
             &this->m_nextBuffer,pFVar1);
  (this->m_buffers).
  super__Vector_base<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_buffers).
  super__Vector_base<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_buffers).
  super__Vector_base<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (1 < basename->_M_string_length) {
    memset((this->m_currentBuffer).
           super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
           ,4000000);
    memset((this->m_nextBuffer).
           super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
           ,4000000);
    std::
    vector<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
    ::reserve(&this->m_buffers,0x10);
    return;
  }
  __assert_fail("basename.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/AsyncLogging.cc"
                ,0x16,"tt::AsyncLogging::AsyncLogging(const std::string &, int)");
}

Assistant:

AsyncLogging::AsyncLogging(const std::string& basename, int flushInterval)
	:m_flushInterval(flushInterval),
	m_running(false),
	m_basename(basename),
	m_thread(std::bind(&AsyncLogging::threadFunc,this),"Logging"),
	m_latch(1),
	m_mutex(),
	m_cond(m_mutex),
	m_currentBuffer(new Buffer),
	m_nextBuffer(new Buffer),
	m_buffers(){

		assert(basename.size() > 1);

		m_currentBuffer->bzero();
		m_nextBuffer->bzero();
		m_buffers.reserve(16);

}